

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.h
# Opt level: O2

void __thiscall L15_4::LabeledSales::NBadIndex::~NBadIndex(NBadIndex *this)

{
  *(undefined ***)&this->super_BadIndex = &PTR__NBadIndex_0012fb70;
  std::__cxx11::string::~string((string *)&this->_lbl);
  std::logic_error::~logic_error((logic_error *)this);
  return;
}

Assistant:

virtual ~NBadIndex() throw() {}